

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O2

void Kernel::LiteralSelector::ensureSomeColoredSelected(Clause *c,uint eligible)

{
  Literal **ppLVar1;
  Literal *pLVar2;
  uint uVar3;
  Color CVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  
  CVar4 = Clause::color(c);
  if (CVar4 != COLOR_TRANSPARENT) {
    uVar5 = (uint)((ulong)*(undefined8 *)&c->field_0x38 >> 0x20);
    uVar8 = uVar5 & 0xfffff;
    lVar7 = 0;
    do {
      uVar3 = uVar8;
      if (uVar8 == (uint)lVar7) {
        do {
          uVar6 = uVar3;
          if (eligible <= uVar6) {
            return;
          }
          uVar3 = uVar6 + 1;
        } while (((c->_literals[(int)uVar6]->super_Term).field_0xf & 0x30) == 0);
        uVar5 = uVar5 & 0xfffff;
        pLVar2 = c->_literals[uVar5];
        c->_literals[uVar5] = c->_literals[(int)uVar6];
        c->_literals[(int)uVar6] = pLVar2;
        Clause::setSelected(c,uVar8 + 1);
        return;
      }
      ppLVar1 = c->_literals + lVar7;
      lVar7 = lVar7 + 1;
    } while ((((*ppLVar1)->super_Term).field_0xf & 0x30) == 0);
  }
  return;
}

Assistant:

void LiteralSelector::ensureSomeColoredSelected(Clause* c, unsigned eligible)
{
  if(c->color()==COLOR_TRANSPARENT) {
    //if no literal is colored, do nothing
    return;
  }

  unsigned selCnt=c->numSelected();

  for(unsigned i=0;i<selCnt;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      return;
    }
  }

  for(unsigned i=selCnt;i<eligible;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      swap((*c)[selCnt], (*c)[i]);
      c->setSelected(selCnt+1);
      return;
    }
  }

  ASS(eligible < c->length() || //the colored literals are not among the eligible ones ...
      c->splits());             // .. unless the color comes from the propositional part
}